

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

char * __thiscall cmCacheManager::CacheEntry::GetProperty(CacheEntry *this,string *prop)

{
  bool bVar1;
  char *pcVar2;
  
  bVar1 = std::operator==(prop,"TYPE");
  if (bVar1) {
    pcVar2 = cmState::CacheEntryTypeToString(this->Type);
    return pcVar2;
  }
  bVar1 = std::operator==(prop,"VALUE");
  if (bVar1) {
    return (this->Value)._M_dataplus._M_p;
  }
  pcVar2 = cmPropertyMap::GetPropertyValue(&this->Properties,prop);
  return pcVar2;
}

Assistant:

const char* cmCacheManager::CacheEntry::GetProperty(
  const std::string& prop) const
{
  if (prop == "TYPE") {
    return cmState::CacheEntryTypeToString(this->Type);
  }
  if (prop == "VALUE") {
    return this->Value.c_str();
  }
  return this->Properties.GetPropertyValue(prop);
}